

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5ExprNodeFirst(Fts5Expr *pExpr,Fts5ExprNode *pNode)

{
  Fts5IndexIter **ppIter;
  Fts5ExprNearset *pFVar1;
  Fts5ExprPhrase *pFVar2;
  Fts5IndexIter *pFVar3;
  u8 *puVar4;
  Fts5ExprNode *pNode_00;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  Fts5ExprTerm *pFVar11;
  int local_54;
  
  pNode->bEof = 0;
  pNode->bNomatch = 0;
  if ((pNode->eType == 9) || (pNode->eType == 4)) {
    pFVar1 = pNode->pNear;
    if (0 < pFVar1->nPhrase) {
      lVar10 = 0;
      do {
        pFVar2 = pFVar1->apPhrase[lVar10];
        iVar8 = pFVar2->nTerm;
        if (iVar8 == 0) {
          pNode->bEof = 1;
          bVar5 = false;
          local_54 = 0;
        }
        else {
          bVar5 = iVar8 < 1;
          if (0 < iVar8) {
            lVar9 = 0;
            do {
              bVar5 = false;
              pFVar11 = pFVar2->aTerm + lVar9;
              do {
                ppIter = &pFVar11->pIter;
                pFVar3 = pFVar11->pIter;
                if (pFVar3 != (Fts5IndexIter *)0x0) {
                  puVar4 = pFVar3[1].pData;
                  fts5IterClose(pFVar3);
                  puVar4[0x3c] = '\0';
                  puVar4[0x3d] = '\0';
                  puVar4[0x3e] = '\0';
                  puVar4[0x3f] = '\0';
                  *ppIter = (Fts5IndexIter *)0x0;
                }
                iVar7 = sqlite3Fts5IndexQuery
                                  (pExpr->pIndex,pFVar11->pTerm,pFVar11->nQueryTerm,
                                   (uint)(pFVar2->aTerm[lVar9].bPrefix != '\0') +
                                   (uint)(pExpr->bDesc != 0) * 2,pFVar1->pColset,ppIter);
                iVar8 = iVar7;
                if ((iVar7 == 0) && (iVar8 = local_54, (*ppIter)->bEof == '\0')) {
                  bVar5 = true;
                }
                local_54 = iVar8;
                if (iVar7 != 0) {
                  bVar6 = false;
                  goto LAB_001e50a9;
                }
                pFVar11 = pFVar11->pSynonym;
              } while (pFVar11 != (Fts5ExprTerm *)0x0);
              bVar6 = true;
              if (!bVar5) {
                pNode->bEof = 1;
                bVar6 = false;
                local_54 = 0;
              }
LAB_001e50a9:
              if (!bVar6) {
                bVar5 = false;
                break;
              }
              lVar9 = lVar9 + 1;
              bVar5 = pFVar2->nTerm <= lVar9;
            } while (lVar9 < pFVar2->nTerm);
          }
        }
        if (!bVar5) goto LAB_001e51c0;
        lVar10 = lVar10 + 1;
      } while (lVar10 < pFVar1->nPhrase);
    }
    pNode->bEof = 0;
  }
  else {
    if (pNode->xNext != (_func_int_Fts5Expr_ptr_Fts5ExprNode_ptr_int_i64 *)0x0) {
      iVar8 = pNode->nChild;
      iVar7 = 0;
      if (iVar8 < 1) {
        local_54 = 0;
        iVar7 = 0;
      }
      else {
        lVar10 = 6;
        do {
          pNode_00 = pNode->apChild[lVar10 + -6];
          local_54 = fts5ExprNodeFirst(pExpr,pNode_00);
          iVar7 = iVar7 + pNode_00->bEof;
          iVar8 = pNode->nChild;
          if ((long)iVar8 <= lVar10 + -5) break;
          lVar10 = lVar10 + 1;
        } while (local_54 == 0);
      }
      pNode->iRowid = pNode->apChild[0]->iRowid;
      if (pNode->eType == 1) {
        if (iVar8 == iVar7) {
          fts5ExprSetEof(pNode);
        }
      }
      else if (pNode->eType == 2) {
        if (0 < iVar7) {
          fts5ExprSetEof(pNode);
        }
      }
      else {
        pNode->bEof = pNode->apChild[0]->bEof;
      }
      goto LAB_001e51c0;
    }
    pNode->bEof = 1;
  }
  local_54 = 0;
LAB_001e51c0:
  if ((local_54 == 0) && (local_54 = 0, pNode->bEof == 0)) {
    switch(pNode->eType) {
    case 1:
      fts5ExprNodeTest_OR(pExpr,pNode);
      break;
    case 2:
      iVar8 = fts5ExprNodeTest_AND(pExpr,pNode);
      return iVar8;
    default:
      iVar8 = fts5ExprNodeTest_NOT(pExpr,pNode);
      return iVar8;
    case 4:
      pFVar2 = pNode->pNear->apPhrase[0];
      pFVar3 = pFVar2->aTerm[0].pIter;
      iVar8 = pFVar3->nData;
      (pFVar2->poslist).n = iVar8;
      if (pExpr->pConfig->eDetail == 0) {
        (pFVar2->poslist).p = pFVar3->pData;
      }
      pNode->iRowid = pFVar3->iRowid;
      pNode->bNomatch = (uint)(iVar8 == 0);
      break;
    case 9:
      iVar8 = fts5ExprNodeTest_STRING(pExpr,pNode);
      return iVar8;
    }
    local_54 = 0;
  }
  return local_54;
}

Assistant:

static int fts5ExprNodeFirst(Fts5Expr *pExpr, Fts5ExprNode *pNode){
  int rc = SQLITE_OK;
  pNode->bEof = 0;
  pNode->bNomatch = 0;

  if( Fts5NodeIsString(pNode) ){
    /* Initialize all term iterators in the NEAR object. */
    rc = fts5ExprNearInitAll(pExpr, pNode);
  }else if( pNode->xNext==0 ){
    pNode->bEof = 1;
  }else{
    int i;
    int nEof = 0;
    for(i=0; i<pNode->nChild && rc==SQLITE_OK; i++){
      Fts5ExprNode *pChild = pNode->apChild[i];
      rc = fts5ExprNodeFirst(pExpr, pNode->apChild[i]);
      assert( pChild->bEof==0 || pChild->bEof==1 );
      nEof += pChild->bEof;
    }
    pNode->iRowid = pNode->apChild[0]->iRowid;

    switch( pNode->eType ){
      case FTS5_AND:
        if( nEof>0 ) fts5ExprSetEof(pNode);
        break;

      case FTS5_OR:
        if( pNode->nChild==nEof ) fts5ExprSetEof(pNode);
        break;

      default:
        assert( pNode->eType==FTS5_NOT );
        pNode->bEof = pNode->apChild[0]->bEof;
        break;
    }
  }

  if( rc==SQLITE_OK ){
    rc = fts5ExprNodeTest(pExpr, pNode);
  }
  return rc;
}